

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::EGLImage::EGLImage
          (EGLImage *this,SharedPtr<tcu::ThreadUtil::Event> *event,
          SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> *sync)

{
  deInt32 *pdVar1;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_28;
  SharedPtr<tcu::ThreadUtil::Event> local_18;
  
  local_18.m_ptr = event->m_ptr;
  local_18.m_state = event->m_state;
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_18.m_state)->strongRefCount = (local_18.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_18.m_state)->weakRefCount = (local_18.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_28.m_ptr = sync->m_ptr;
  local_28.m_state = sync->m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  Object::Object(&this->super_Object,"EGLImage",&local_18,&local_28);
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.m_ptr = (FenceSync *)0x0;
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_28.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_28.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_28.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_28.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_18.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_18.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_18.m_ptr = (Event *)0x0;
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_18.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_18.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_18.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  (this->super_Object).super_Object._vptr_Object = (_func_int **)&PTR__Object_003eb498;
  this->image = (EGLImageKHR)0x0;
  return;
}

Assistant:

EGLImage::EGLImage (SharedPtr<tcu::ThreadUtil::Event> event, SharedPtr<FenceSync> sync)
	: Object	("EGLImage", event, sync)
	, image		(EGL_NO_IMAGE_KHR)
{
}